

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lr0.c
# Opt level: O0

void show_cores(void)

{
  int iVar1;
  uint uVar2;
  int itemno;
  int n;
  int k;
  int j;
  int i;
  core *p;
  
  itemno = 0;
  for (_j = first_state; _j != (core *)0x0; _j = _j->next) {
    if (itemno != 0) {
      printf("\n");
    }
    printf("state %d, number = %d, accessing symbol = %s\n",(ulong)(uint)itemno,
           (ulong)(uint)_j->number,symbol_name[_j->accessing_symbol]);
    iVar1 = _j->nitems;
    for (k = 0; k < iVar1; k = k + 1) {
      uVar2 = _j->items[k];
      printf("%4d  ",(ulong)uVar2);
      for (n = uVar2; -1 < ritem[n]; n = n + 1) {
      }
      printf("%s :",symbol_name[rlhs[-ritem[n]]]);
      n = rrhs[-ritem[n]];
      while (n < (int)uVar2) {
        printf(" %s",symbol_name[ritem[n]]);
        n = n + 1;
      }
      printf(" .");
      while (-1 < ritem[n]) {
        printf(" %s",symbol_name[ritem[n]]);
        n = n + 1;
      }
      printf("\n");
      fflush(_stdout);
    }
    itemno = itemno + 1;
  }
  return;
}

Assistant:

void show_cores()
{
    core *p;
    int i, j, k, n;
    int itemno;

    k = 0;
    for (p = first_state; p; ++k, p = p->next)
    {
	if (k) printf("\n");
	printf("state %d, number = %d, accessing symbol = %s\n",
		k, p->number, symbol_name[p->accessing_symbol]);
	n = p->nitems;
	for (i = 0; i < n; ++i)
	{
	    itemno = p->items[i];
	    printf("%4d  ", itemno);
	    j = itemno;
	    while (ritem[j] >= 0) ++j;
	    printf("%s :", symbol_name[rlhs[-ritem[j]]]);
	    j = rrhs[-ritem[j]];
	    while (j < itemno)
		printf(" %s", symbol_name[ritem[j++]]);
	    printf(" .");
	    while (ritem[j] >= 0)
		printf(" %s", symbol_name[ritem[j++]]);
	    printf("\n");
	    fflush(stdout);
	}
    }
}